

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O0

void __thiscall
google::LogMessage::Init
          (LogMessage *this,char *file,int line,LogSeverity severity,SendMethod send_method)

{
  long lVar1;
  _Setfill<char> _Var2;
  _Setw _Var3;
  uint uVar4;
  int iVar5;
  LogMessageData *pLVar6;
  ostream *poVar7;
  int *piVar8;
  char *pcVar9;
  undefined8 uVar10;
  size_t sVar11;
  ulong uVar12;
  undefined8 in_R9;
  long *in_FS_OFFSET;
  WallTime WVar13;
  undefined1 local_128 [8];
  string stacktrace;
  char fileline [128];
  int usecs;
  WallTime now;
  MutexLock l;
  SendMethod send_method_local;
  char local_30;
  LogSeverity severity_local;
  int line_local;
  char *file_local;
  LogMessage *this_local;
  
  this->allocated_ = (LogMessageData *)0x0;
  if ((severity == 3) && ((exit_on_dfatal & 1) != 0)) {
    ::glog_internal_namespace_::MutexLock::MutexLock((MutexLock *)&now,(Mutex *)fatal_msg_lock);
    if ((fatal_msg_exclusive & 1) == 0) {
      this->data_ = (LogMessageData *)fatal_msg_data_shared;
      this->data_->first_fatal_ = false;
    }
    else {
      fatal_msg_exclusive = 0;
      this->data_ = (LogMessageData *)&fatal_msg_data_exclusive;
      this->data_->first_fatal_ = true;
    }
    ::glog_internal_namespace_::MutexLock::~MutexLock((MutexLock *)&now);
  }
  else {
    if ((*(byte *)(*in_FS_OFFSET + -0x7730) & 1) == 0) {
      pLVar6 = (LogMessageData *)operator_new(0x7728);
      LogMessageData::LogMessageData(pLVar6);
      this->allocated_ = pLVar6;
      this->data_ = this->allocated_;
    }
    else {
      *(undefined1 *)(*in_FS_OFFSET + -0x7730) = 0;
      lVar1 = *in_FS_OFFSET;
      LogMessageData::LogMessageData((LogMessageData *)(lVar1 + -0x7728));
      this->data_ = (LogMessageData *)(lVar1 + -0x7728);
    }
    this->data_->first_fatal_ = false;
  }
  poVar7 = stream(this);
  std::ios::fill((char)poVar7 + (char)poVar7->_vptr_basic_ostream[-3]);
  piVar8 = __errno_location();
  this->data_->preserved_errno_ = *piVar8;
  local_30 = (char)severity;
  this->data_->severity_ = local_30;
  this->data_->line_ = line;
  pLVar6 = this->data_;
  *(undefined8 *)&pLVar6->field_0x76a8 = in_R9;
  pLVar6->send_method_ = send_method;
  (this->data_->field_6).sink_ = (LogSink *)0x0;
  (this->data_->field_6).sink_ = (LogSink *)0x0;
  WVar13 = glog_internal_namespace_::WallTime_Now();
  this->data_->timestamp_ = (long)WVar13;
  localtime_r(&this->data_->timestamp_,(tm *)&this->data_->tm_time_);
  lVar1 = this->data_->timestamp_;
  this->data_->num_chars_to_log_ = 0;
  this->data_->num_chars_to_syslog_ = 0;
  pcVar9 = glog_internal_namespace_::const_basename(file);
  this->data_->basename_ = pcVar9;
  this->data_->fullname_ = file;
  this->data_->has_been_flushed_ = false;
  if (((fLB::FLAGS_log_prefix & 1) != 0) && (line != -1)) {
    poVar7 = stream(this);
    poVar7 = std::operator<<(poVar7,**(char **)(LogSeverityNames + (long)severity * 8));
    _Var3 = std::setw(2);
    poVar7 = std::operator<<(poVar7,_Var3);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,(this->data_->tm_time_).tm_mon + 1);
    _Var3 = std::setw(2);
    poVar7 = std::operator<<(poVar7,_Var3);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,(this->data_->tm_time_).tm_mday);
    poVar7 = std::operator<<(poVar7,' ');
    _Var3 = std::setw(2);
    poVar7 = std::operator<<(poVar7,_Var3);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,(this->data_->tm_time_).tm_hour);
    poVar7 = std::operator<<(poVar7,':');
    _Var3 = std::setw(2);
    poVar7 = std::operator<<(poVar7,_Var3);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,(this->data_->tm_time_).tm_min);
    poVar7 = std::operator<<(poVar7,':');
    _Var3 = std::setw(2);
    poVar7 = std::operator<<(poVar7,_Var3);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,(this->data_->tm_time_).tm_sec);
    poVar7 = std::operator<<(poVar7,".");
    _Var3 = std::setw(6);
    poVar7 = std::operator<<(poVar7,_Var3);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,(int)((WVar13 - (double)lVar1) * 1000000.0))
    ;
    poVar7 = std::operator<<(poVar7,' ');
    _Var2 = std::setfill<char>(' ');
    poVar7 = std::operator<<(poVar7,_Var2._M_c);
    _Var3 = std::setw(5);
    poVar7 = std::operator<<(poVar7,_Var3);
    uVar4 = glog_internal_namespace_::GetTID();
    uVar10 = std::ostream::operator<<(poVar7,uVar4);
    _Var2 = std::setfill<char>('0');
    poVar7 = std::operator<<(uVar10,_Var2._M_c);
    std::operator<<(poVar7,' ');
  }
  sVar11 = LogStream::pcount(&this->data_->stream_);
  this->data_->num_prefix_chars_ = sVar11;
  uVar12 = std::__cxx11::string::empty();
  if ((uVar12 & 1) == 0) {
    snprintf(stacktrace.field_2._M_local_buf + 8,0x80,"%s:%d",this->data_->basename_,
             (ulong)(uint)line);
    pcVar9 = (char *)std::__cxx11::string::c_str();
    iVar5 = strcmp(pcVar9,stacktrace.field_2._M_local_buf + 8);
    if (iVar5 == 0) {
      std::__cxx11::string::string((string *)local_128);
      glog_internal_namespace_::DumpStackTraceToString((string *)local_128);
      poVar7 = stream(this);
      poVar7 = std::operator<<(poVar7," (stacktrace:\n");
      poVar7 = std::operator<<(poVar7,(string *)local_128);
      std::operator<<(poVar7,") ");
      std::__cxx11::string::~string((string *)local_128);
    }
  }
  return;
}

Assistant:

void LogMessage::Init(const char* file,
                      int line,
                      LogSeverity severity,
                      void (LogMessage::*send_method)()) {
  allocated_ = NULL;
  if (severity != GLOG_FATAL || !exit_on_dfatal) {
#ifdef GLOG_THREAD_LOCAL_STORAGE
    // No need for locking, because this is thread local.
    if (thread_data_available) {
      thread_data_available = false;
#ifdef HAVE_ALIGNED_STORAGE
      data_ = new (&thread_msg_data) LogMessageData;
#else
      const uintptr_t kAlign = sizeof(void*) - 1;

      char* align_ptr =
          reinterpret_cast<char*>(reinterpret_cast<uintptr_t>(thread_msg_data + kAlign) & ~kAlign);
      data_ = new (align_ptr) LogMessageData;
      assert(reinterpret_cast<uintptr_t>(align_ptr) % sizeof(void*) == 0);
#endif
    } else {
      allocated_ = new LogMessageData();
      data_ = allocated_;
    }
#else // !defined(GLOG_THREAD_LOCAL_STORAGE)
    allocated_ = new LogMessageData();
    data_ = allocated_;
#endif // defined(GLOG_THREAD_LOCAL_STORAGE)
    data_->first_fatal_ = false;
  } else {
    MutexLock l(&fatal_msg_lock);
    if (fatal_msg_exclusive) {
      fatal_msg_exclusive = false;
      data_ = &fatal_msg_data_exclusive;
      data_->first_fatal_ = true;
    } else {
      data_ = &fatal_msg_data_shared;
      data_->first_fatal_ = false;
    }
  }

  stream().fill('0');
  data_->preserved_errno_ = errno;
  data_->severity_ = severity;
  data_->line_ = line;
  data_->send_method_ = send_method;
  data_->sink_ = NULL;
  data_->outvec_ = NULL;
  WallTime now = WallTime_Now();
  data_->timestamp_ = static_cast<time_t>(now);
  localtime_r(&data_->timestamp_, &data_->tm_time_);
  int usecs = static_cast<int>((now - data_->timestamp_) * 1000000);

  data_->num_chars_to_log_ = 0;
  data_->num_chars_to_syslog_ = 0;
  data_->basename_ = const_basename(file);
  data_->fullname_ = file;
  data_->has_been_flushed_ = false;

  // If specified, prepend a prefix to each line.  For example:
  //    I1018 160715 f5d4fbb0 logging.cc:1153]
  //    (log level, GMT month, date, time, thread_id, file basename, line)
  // We exclude the thread_id for the default thread.
  if (FLAGS_log_prefix && (line != kNoLogPrefix)) {
    stream() << LogSeverityNames[severity][0]
             << setw(2) << 1+data_->tm_time_.tm_mon
             << setw(2) << data_->tm_time_.tm_mday
             << ' '
             << setw(2) << data_->tm_time_.tm_hour  << ':'
             << setw(2) << data_->tm_time_.tm_min   << ':'
             << setw(2) << data_->tm_time_.tm_sec   << "."
             << setw(6) << usecs
             << ' '
             << setfill(' ') << setw(5)
             << static_cast<unsigned int>(GetTID()) << setfill('0')
             << ' ';
             // @huihut delete file & line
            //  << data_->basename_ << ':' << data_->line_ << "] ";
  }
  data_->num_prefix_chars_ = data_->stream_.pcount();

  if (!FLAGS_log_backtrace_at.empty()) {
    char fileline[128];
    snprintf(fileline, sizeof(fileline), "%s:%d", data_->basename_, line);
#ifdef HAVE_STACKTRACE
    if (!strcmp(FLAGS_log_backtrace_at.c_str(), fileline)) {
      string stacktrace;
      DumpStackTraceToString(&stacktrace);
      stream() << " (stacktrace:\n" << stacktrace << ") ";
    }
#endif
  }
}